

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void trex_free(TRex *exp)

{
  if (exp != (TRex *)0x0) {
    free(exp->_nodes);
    free(exp->_jmpbuf);
    free(exp->_matches);
    free(exp);
    return;
  }
  return;
}

Assistant:

void trex_free(TRex * exp) {
	if (exp)	{
		if (exp->_nodes) {
			free(exp->_nodes);
		}

		if (exp->_jmpbuf) {
			free(exp->_jmpbuf);
		}

		if (exp->_matches) {
			free(exp->_matches);
		}

		free(exp);
	}
}